

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_abs_h(CPUTriCoreState *env,target_ulong_conflict arg)

{
  bool local_2d;
  uint local_2c;
  uint local_28;
  uint local_24;
  int32_t ret;
  int32_t avf;
  int32_t ovf;
  int32_t i;
  int32_t h;
  target_ulong_conflict arg_local;
  CPUTriCoreState *env_local;
  
  ret = 0;
  local_24 = 0;
  local_28 = 0;
  for (avf = 0; avf < 2; avf = avf + 1) {
    local_2c = sextract32(arg,avf << 4,0x10);
    if ((int)local_2c < 0) {
      local_2c = -local_2c;
    }
    local_2d = 0x7fff < (int)local_2c || (int)local_2c < -0x8000;
    ret = (uint)local_2d | ret;
    local_24 = local_2c ^ local_2c << 1 | local_24;
    local_28 = (local_2c & 0xffff) << ((byte)(avf << 4) & 0x1f) | local_28;
  }
  env->PSW_USB_V = ret << 0x1f;
  env->PSW_USB_SV = env->PSW_USB_V | env->PSW_USB_SV;
  env->PSW_USB_AV = local_24 << 0x10;
  env->PSW_USB_SAV = env->PSW_USB_AV | env->PSW_USB_SAV;
  return local_28;
}

Assistant:

uint32_t helper_abs_h(CPUTriCoreState *env, target_ulong arg)
{
    int32_t h, i;
    int32_t ovf = 0;
    int32_t avf = 0;
    int32_t ret = 0;

    for (i = 0; i < 2; i++) {
        h = sextract32(arg, i * 16, 16);
        h = (h >= 0) ? h : (0 - h);
        ovf |= (h > 0x7FFF) || (h < -0x8000);
        avf |= h ^ h * 2u;
        ret |= (h & 0xffff) << (i * 16);
    }

    env->PSW_USB_V = ovf << 31;
    env->PSW_USB_SV |= env->PSW_USB_V;
    env->PSW_USB_AV = avf << 16;
    env->PSW_USB_SAV |= env->PSW_USB_AV;

    return ret;
}